

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

void __thiscall
JsUtil::
BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this)

{
  uint bucketCount;
  hash_t hVar1;
  uint uVar2;
  EntryType *dst;
  long lVar3;
  int i;
  long lVar4;
  CharacterBuffer<char16_t> local_68;
  Type *local_58;
  uint local_4c;
  int *local_48;
  int *newBuckets;
  int local_34 [2];
  int modIndex;
  
  uVar2 = this->count * 2;
  local_34[0] = 0x4b;
  bucketCount = DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>::GetBucketSize(uVar2,local_34);
  local_48 = (int *)0x0;
  newBuckets = (int *)0x0;
  if (bucketCount == this->bucketCount) {
    dst = AllocateEntries(this,uVar2,true);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>>,JsUtil::CharacterBuffer<char16_t>,Memory::Recycler>
              (dst,(long)(int)uVar2,&this->entries,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    Memory::
    WriteBarrierPtr<JsUtil::SimpleHashedEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>_>_>
    ::WriteBarrierSet(&this->entries,dst);
    this->size = uVar2;
    this->modFunctionIndex = local_34[0];
  }
  else {
    Allocate(this,&local_48,(EntryType **)&newBuckets,bucketCount,uVar2);
    local_58 = &this->entries;
    local_4c = uVar2;
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>>,JsUtil::CharacterBuffer<char16_t>,Memory::Recycler>
              ((SimpleHashedEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>_>
                *)newBuckets,(long)(int)uVar2,local_58,(long)this->count);
    this->modFunctionIndex = local_34[0];
    lVar3 = 0;
    for (lVar4 = 0; lVar4 < this->count; lVar4 = lVar4 + 1) {
      if (-2 < *(int *)((long)newBuckets + lVar3 + 0x10)) {
        CharacterBuffer<char16_t>::CharacterBuffer
                  (&local_68,(CharacterBuffer<char16_t> *)((long)newBuckets + lVar3));
        hVar1 = CharacterBuffer::operator_cast_to_unsigned_int((CharacterBuffer *)&local_68);
        uVar2 = GetBucket(hVar1 * 2 + 1,bucketCount,this->modFunctionIndex);
        *(int *)((long)newBuckets + lVar3 + 0x10) = local_48[(int)uVar2];
        local_48[(int)uVar2] = (int)lVar4;
      }
      lVar3 = lVar3 + 0x18;
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    uVar2 = local_4c;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,local_4c,local_4c - this->size);
    }
    Memory::WriteBarrierPtr<int>::WriteBarrierSet(&this->buckets,local_48);
    Memory::
    WriteBarrierPtr<JsUtil::SimpleHashedEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>_>_>
    ::WriteBarrierSet(local_58,(SimpleHashedEntry<JsUtil::CharacterBuffer<char16_t>,_JsUtil::CharacterBuffer<char16_t>_>
                                *)newBuckets);
    this->bucketCount = bucketCount;
    this->size = uVar2;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }